

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r6p_1lin.cpp
# Opt level: O3

vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
* solve_xy_from_AM(vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   *__return_storage_ptr__,double *z,int nroots,MatrixXd *AM)

{
  PointerType *ppdVar1;
  double *pdVar2;
  iterator __position;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int j;
  long lVar10;
  DstEvaluatorType *pDVar11;
  SrcEvaluatorType *pSVar12;
  ulong uVar13;
  double *pdVar14;
  PointerType pdVar15;
  Index IVar16;
  SrcEvaluatorType *pSVar17;
  Index index_1;
  long lVar18;
  undefined1 *puVar19;
  double *pdVar20;
  double *pdVar21;
  long lVar22;
  MatrixXd AMs;
  MatrixXd AA;
  VectorXd s;
  SrcEvaluatorType srcEvaluator;
  double zi [8];
  DenseStorage<double,__1,__1,__1,_0> local_388;
  undefined1 local_370 [56];
  double local_338;
  undefined8 uStack_330;
  double local_328;
  undefined8 uStack_320;
  CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
  local_318;
  double local_2d8;
  undefined8 uStack_2d0;
  vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>> *local_2c0
  ;
  long local_2b8;
  long local_2b0;
  DstEvaluatorType local_2a8;
  ulong local_288;
  double *local_280;
  ulong local_278;
  SrcXprType local_270;
  generic_dense_assignment_kernel<_d44aba81_> local_260;
  undefined8 local_240;
  undefined8 uStack_238;
  SrcEvaluatorType *local_230;
  double *local_228;
  undefined8 uStack_220;
  undefined1 local_218 [136];
  double local_190;
  double *local_180;
  double *local_170;
  double local_160;
  double *local_150;
  double *local_140;
  double local_130;
  double *local_120;
  double *local_110;
  double local_100;
  double *local_f0;
  double *local_e0;
  double local_d0;
  double *local_c0;
  double *local_b0;
  undefined8 local_a0;
  double *local_90;
  double *local_80;
  double *local_78;
  double local_70 [8];
  
  local_388.m_data = (double *)0x0;
  local_388.m_rows = 0;
  local_388.m_cols = 0;
  local_280 = z;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_388,0x540,0x15,0x40);
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pdVar2 = (AM->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  lVar10 = (AM->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  lVar18 = 0;
  pdVar14 = local_388.m_data;
  do {
    if (0 < local_388.m_cols) {
      pdVar20 = pdVar2 + (int)(&DAT_0067d900)[lVar18];
      IVar16 = local_388.m_cols;
      pdVar21 = pdVar14;
      do {
        *pdVar21 = *pdVar20;
        pdVar20 = pdVar20 + lVar10;
        pdVar21 = pdVar21 + local_388.m_rows;
        IVar16 = IVar16 + -1;
      } while (IVar16 != 0);
    }
    lVar18 = lVar18 + 1;
    pdVar14 = pdVar14 + 1;
  } while (lVar18 != 0x15);
  local_2c0 = (vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>
               *)__return_storage_ptr__;
  if (0 < nroots) {
    local_288 = (ulong)(uint)nroots;
    uVar13 = 0;
    do {
      local_228 = (double *)local_280[uVar13];
      lVar10 = 1;
      pdVar2 = local_228;
      do {
        pdVar2 = (double *)((double)pdVar2 * (double)local_228);
        local_70[lVar10 + -1] = (double)pdVar2;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 8);
      uStack_220 = 0;
      local_218._0_8_ = (double *)0x15;
      local_218._8_8_ = 0x15;
      local_218._16_8_ = 0;
      local_278 = uVar13;
      local_78 = local_228;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_370,
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)local_218);
      local_218._0_8_ = local_388.m_data + local_388.m_rows * 5;
      local_218._8_8_ = local_388.m_rows;
      local_218._32_8_ = 0;
      local_218._40_8_ = (int *)0x5;
      local_218._48_8_ = local_388.m_rows;
      local_318.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data =
           (PointerType)local_370._0_8_;
      local_318.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_rows.
      m_value = local_370._8_8_;
      local_318.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_startRow.
      m_value = 0;
      local_318.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_startCol.
      m_value = 0;
      local_318.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      m_outerStride = local_370._8_8_;
      local_318.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_xpr =
           (XprTypeNested)local_370;
      local_218._24_8_ = &local_388;
      Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>::
      operator=((MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1> *)
                &local_318,
                (MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1> *)
                local_218);
      local_218._0_8_ = local_388.m_data + local_388.m_rows * 6;
      local_218._8_8_ = local_388.m_rows;
      local_218._32_8_ = 0;
      local_218._40_8_ = (int *)0x6;
      local_218._48_8_ = local_388.m_rows;
      local_318.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data =
           (PointerType)
           (&(((block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true> *)
              local_370._0_8_)->
             super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
             ).m_data + local_370._8_8_);
      local_318.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_rows.
      m_value = local_370._8_8_;
      local_318.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_startRow.
      m_value = 0;
      local_318.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_startCol.
      m_value = 1;
      local_318.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      m_outerStride = local_370._8_8_;
      local_318.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_xpr =
           (XprTypeNested)local_370;
      local_218._24_8_ = &local_388;
      Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>::
      operator=((MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1> *)
                &local_318,
                (MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1> *)
                local_218);
      local_218._0_8_ = local_388.m_data + local_388.m_rows * 9;
      local_218._8_8_ = local_388.m_rows;
      local_218._32_8_ = 0;
      local_218._40_8_ = &DAT_00000009;
      local_218._48_8_ = local_388.m_rows;
      local_318.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data =
           (PointerType)
           (&(((block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true> *)
              local_370._0_8_)->
             super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
             ).m_data + local_370._8_8_ * 2);
      local_318.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_rows.
      m_value = local_370._8_8_;
      local_318.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_startRow.
      m_value = 0;
      local_318.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_startCol.
      m_value = 2;
      local_318.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      m_outerStride = local_370._8_8_;
      local_318.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_xpr =
           (XprTypeNested)local_370;
      local_218._24_8_ = &local_388;
      Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>::
      operator=((MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1> *)
                &local_318,
                (MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1> *)
                local_218);
      local_218._0_8_ = local_388.m_data + local_388.m_rows * 0xf;
      local_218._8_8_ = local_388.m_rows;
      local_218._32_8_ = 0;
      local_218._40_8_ = (int *)0xf;
      local_218._48_8_ = local_388.m_rows;
      local_318.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data =
           (PointerType)(local_370._0_8_ + local_370._8_8_ * 0x18);
      local_318.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_rows.
      m_value = local_370._8_8_;
      local_318.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_startRow.
      m_value = 0;
      local_318.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_startCol.
      m_value = 3;
      local_318.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      m_outerStride = local_370._8_8_;
      local_318.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_xpr =
           (XprTypeNested)local_370;
      local_218._24_8_ = &local_388;
      Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>::
      operator=((MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1> *)
                &local_318,
                (MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1> *)
                local_218);
      local_218._0_8_ = local_388.m_data + local_388.m_rows * 0x1a;
      local_218._8_8_ = local_388.m_rows;
      local_218._32_8_ = 0;
      local_218._40_8_ = (int *)0x1a;
      local_218._48_8_ = local_388.m_rows;
      local_318.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data =
           (PointerType)(local_370._8_8_ * 0x20 + local_370._0_8_);
      local_318.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_rows.
      m_value = local_370._8_8_;
      local_318.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_startRow.
      m_value = 0;
      local_318.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_startCol.
      m_value = 4;
      local_318.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      m_outerStride = local_370._8_8_;
      local_318.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_xpr =
           (XprTypeNested)local_370;
      local_218._24_8_ = &local_388;
      Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>::
      operator=((MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1> *)
                &local_318,
                (MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1> *)
                local_218);
      local_218._0_8_ = local_388.m_data + local_388.m_rows * 0x2b;
      local_218._8_8_ = local_388.m_rows;
      local_218._32_8_ = 0;
      local_218._40_8_ = (int *)0x2b;
      local_218._48_8_ = local_388.m_rows;
      local_318.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data =
           (PointerType)(local_370._8_8_ * 0x28 + local_370._0_8_);
      local_318.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_rows.
      m_value = local_370._8_8_;
      local_318.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_startRow.
      m_value = 0;
      local_318.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_startCol.
      m_value = 5;
      local_318.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      m_outerStride = local_370._8_8_;
      local_318.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_xpr =
           (XprTypeNested)local_370;
      local_218._24_8_ = &local_388;
      Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>::
      operator=((MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1> *)
                &local_318,
                (MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1> *)
                local_218);
      dVar9 = local_70[4];
      pDVar11 = (DstEvaluatorType *)(local_370._0_8_ + local_370._8_8_ * 2 * 0x18);
      pSVar12 = (SrcEvaluatorType *)local_370._8_8_;
      if ((((ulong)pDVar11 & 7) == 0) &&
         (pSVar12 = (SrcEvaluatorType *)(ulong)((uint)((ulong)pDVar11 >> 3) & 1),
         (long)local_370._8_8_ <= (long)pSVar12)) {
        pSVar12 = (SrcEvaluatorType *)local_370._8_8_;
      }
      if (0 < (long)pSVar12) {
        lVar10 = 0;
        do {
          (&(pDVar11->
            super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>).
            super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
            .m_data)[lVar10] =
               (PointerType)
               (local_388.m_data[lVar10 + local_388.m_rows * 7] * (double)local_228 +
               local_388.m_data[lVar10 + local_388.m_rows * 4]);
          lVar10 = lVar10 + 1;
        } while (pSVar12 != (SrcEvaluatorType *)lVar10);
      }
      lVar10 = local_370._8_8_ - (long)pSVar12;
      puVar19 = &(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                (lVar10 - (lVar10 >> 0x3f) & 0xfffffffffffffffe);
      if (1 < lVar10) {
        do {
          dVar3 = (local_388.m_data +
                  (long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                        local_388.m_rows * 4))[1];
          dVar4 = (local_388.m_data +
                  (long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                        local_388.m_rows * 7))[1];
          ppdVar1 = &(pDVar11->
                     super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                     ).
                     super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                     .m_data + (long)pSVar12;
          *ppdVar1 = (PointerType)
                     (local_388.m_data
                      [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                             local_388.m_rows * 7)] * (double)local_228 +
                     local_388.m_data
                     [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                            local_388.m_rows * 4)]);
          ppdVar1[1] = (PointerType)(dVar4 * (double)local_228 + dVar3);
          pSVar12 = (SrcEvaluatorType *)&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x2
          ;
        } while ((long)pSVar12 < (long)puVar19);
      }
      if ((long)puVar19 < (long)local_370._8_8_) {
        do {
          (&(pDVar11->
            super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>).
            super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
            .m_data)[(long)puVar19] =
               (PointerType)
               (local_388.m_data[(long)(puVar19 + local_388.m_rows * 7)] * (double)local_228 +
               local_388.m_data[(long)(puVar19 + local_388.m_rows * 4)]);
          puVar19 = puVar19 + 1;
        } while ((undefined1 *)local_370._8_8_ != puVar19);
      }
      pdVar15 = (PointerType)(local_370._8_8_ * 0x38 + local_370._0_8_);
      pSVar12 = (SrcEvaluatorType *)local_370._8_8_;
      if ((((ulong)pdVar15 & 7) == 0) &&
         (pSVar12 = (SrcEvaluatorType *)(ulong)((uint)((ulong)pdVar15 >> 3) & 1),
         (long)local_370._8_8_ <= (long)pSVar12)) {
        pSVar12 = (SrcEvaluatorType *)local_370._8_8_;
      }
      if (0 < (long)pSVar12) {
        lVar10 = 0;
        do {
          pdVar15[lVar10] =
               local_388.m_data[lVar10 + local_388.m_rows * 10] * (double)local_228 +
               local_388.m_data[lVar10 + local_388.m_rows * 8];
          lVar10 = lVar10 + 1;
        } while (pSVar12 != (SrcEvaluatorType *)lVar10);
      }
      lVar10 = local_370._8_8_ - (long)pSVar12;
      puVar19 = &(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                (lVar10 - (lVar10 >> 0x3f) & 0xfffffffffffffffe);
      if (1 < lVar10) {
        do {
          dVar3 = (local_388.m_data +
                  (long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                        local_388.m_rows * 8))[1];
          dVar4 = (local_388.m_data +
                  (long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                        local_388.m_rows * 10))[1];
          pdVar15[(long)pSVar12] =
               local_388.m_data
               [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      local_388.m_rows * 10)] * (double)local_228 +
               local_388.m_data
               [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      local_388.m_rows * 8)];
          (pdVar15 + (long)pSVar12)[1] = dVar4 * (double)local_228 + dVar3;
          pSVar12 = (SrcEvaluatorType *)&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x2
          ;
        } while ((long)pSVar12 < (long)puVar19);
      }
      if ((long)puVar19 < (long)local_370._8_8_) {
        do {
          pdVar15[(long)puVar19] =
               local_388.m_data[(long)(puVar19 + local_388.m_rows * 10)] * (double)local_228 +
               local_388.m_data[(long)(puVar19 + local_388.m_rows * 8)];
          puVar19 = puVar19 + 1;
        } while ((undefined1 *)local_370._8_8_ != puVar19);
      }
      pdVar15 = (PointerType)(local_370._8_8_ * 0x40 + local_370._0_8_);
      pSVar12 = (SrcEvaluatorType *)local_370._8_8_;
      if ((((ulong)pdVar15 & 7) == 0) &&
         (pSVar12 = (SrcEvaluatorType *)(ulong)((uint)((ulong)pdVar15 >> 3) & 1),
         (long)local_370._8_8_ <= (long)pSVar12)) {
        pSVar12 = (SrcEvaluatorType *)local_370._8_8_;
      }
      if (0 < (long)pSVar12) {
        lVar10 = 0;
        do {
          pdVar15[lVar10] =
               local_388.m_data[lVar10 + local_388.m_rows * 0x10] * (double)local_228 +
               local_388.m_data[lVar10 + local_388.m_rows * 0xe];
          lVar10 = lVar10 + 1;
        } while (pSVar12 != (SrcEvaluatorType *)lVar10);
      }
      lVar10 = local_370._8_8_ - (long)pSVar12;
      puVar19 = &(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                (lVar10 - (lVar10 >> 0x3f) & 0xfffffffffffffffe);
      if (1 < lVar10) {
        do {
          dVar3 = (local_388.m_data +
                  (long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                        local_388.m_rows * 0xe))[1];
          dVar4 = (local_388.m_data +
                  (long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                        local_388.m_rows * 0x10))[1];
          pdVar15[(long)pSVar12] =
               local_388.m_data
               [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      local_388.m_rows * 0x10)] * (double)local_228 +
               local_388.m_data
               [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      local_388.m_rows * 0xe)];
          (pdVar15 + (long)pSVar12)[1] = dVar4 * (double)local_228 + dVar3;
          pSVar12 = (SrcEvaluatorType *)&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x2
          ;
        } while ((long)pSVar12 < (long)puVar19);
      }
      if ((long)puVar19 < (long)local_370._8_8_) {
        do {
          pdVar15[(long)puVar19] =
               local_388.m_data[(long)(puVar19 + local_388.m_rows * 0x10)] * (double)local_228 +
               local_388.m_data[(long)(puVar19 + local_388.m_rows * 0xe)];
          puVar19 = puVar19 + 1;
        } while ((undefined1 *)local_370._8_8_ != puVar19);
      }
      pDVar11 = (DstEvaluatorType *)(local_370._0_8_ + local_370._8_8_ * 3 * 0x18);
      pSVar12 = (SrcEvaluatorType *)local_370._8_8_;
      if ((((ulong)pDVar11 & 7) == 0) &&
         (pSVar12 = (SrcEvaluatorType *)(ulong)((uint)((ulong)pDVar11 >> 3) & 1),
         (long)local_370._8_8_ <= (long)pSVar12)) {
        pSVar12 = (SrcEvaluatorType *)local_370._8_8_;
      }
      if (0 < (long)pSVar12) {
        lVar10 = 0;
        do {
          (&(pDVar11->
            super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>).
            super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
            .m_data)[lVar10] =
               (PointerType)
               (local_388.m_data[lVar10 + local_388.m_rows * 0x1b] * (double)local_228 +
               local_388.m_data[lVar10 + local_388.m_rows * 0x19]);
          lVar10 = lVar10 + 1;
        } while (pSVar12 != (SrcEvaluatorType *)lVar10);
      }
      lVar10 = local_370._8_8_ - (long)pSVar12;
      puVar19 = &(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                (lVar10 - (lVar10 >> 0x3f) & 0xfffffffffffffffe);
      if (1 < lVar10) {
        do {
          dVar3 = (local_388.m_data +
                  (long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                        local_388.m_rows * 0x19))[1];
          dVar4 = (local_388.m_data +
                  (long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                        local_388.m_rows * 0x1b))[1];
          ppdVar1 = &(pDVar11->
                     super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                     ).
                     super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                     .m_data + (long)pSVar12;
          *ppdVar1 = (PointerType)
                     (local_388.m_data
                      [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                             local_388.m_rows * 0x1b)] * (double)local_228 +
                     local_388.m_data
                     [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                            local_388.m_rows * 0x19)]);
          ppdVar1[1] = (PointerType)(dVar4 * (double)local_228 + dVar3);
          pSVar12 = (SrcEvaluatorType *)&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x2
          ;
        } while ((long)pSVar12 < (long)puVar19);
      }
      if ((long)puVar19 < (long)local_370._8_8_) {
        do {
          (&(pDVar11->
            super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>).
            super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
            .m_data)[(long)puVar19] =
               (PointerType)
               (local_388.m_data[(long)(puVar19 + local_388.m_rows * 0x1b)] * (double)local_228 +
               local_388.m_data[(long)(puVar19 + local_388.m_rows * 0x19)]);
          puVar19 = puVar19 + 1;
        } while ((undefined1 *)local_370._8_8_ != puVar19);
      }
      pdVar15 = (PointerType)(local_370._8_8_ * 0x50 + local_370._0_8_);
      pSVar12 = (SrcEvaluatorType *)local_370._8_8_;
      if ((((ulong)pdVar15 & 7) == 0) &&
         (pSVar12 = (SrcEvaluatorType *)(ulong)((uint)((ulong)pdVar15 >> 3) & 1),
         (long)local_370._8_8_ <= (long)pSVar12)) {
        pSVar12 = (SrcEvaluatorType *)local_370._8_8_;
      }
      if (0 < (long)pSVar12) {
        lVar10 = 0;
        do {
          pdVar15[lVar10] =
               local_388.m_data[lVar10 + local_388.m_rows * 0x2c] * (double)local_228 +
               local_388.m_data[lVar10 + local_388.m_rows * 0x2a];
          lVar10 = lVar10 + 1;
        } while (pSVar12 != (SrcEvaluatorType *)lVar10);
      }
      lVar10 = local_370._8_8_ - (long)pSVar12;
      puVar19 = &(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                (lVar10 - (lVar10 >> 0x3f) & 0xfffffffffffffffe);
      if (1 < lVar10) {
        do {
          dVar3 = (local_388.m_data +
                  (long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                        local_388.m_rows * 0x2a))[1];
          dVar4 = (local_388.m_data +
                  (long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                        local_388.m_rows * 0x2c))[1];
          pdVar15[(long)pSVar12] =
               local_388.m_data
               [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      local_388.m_rows * 0x2c)] * (double)local_228 +
               local_388.m_data
               [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      local_388.m_rows * 0x2a)];
          (pdVar15 + (long)pSVar12)[1] = dVar4 * (double)local_228 + dVar3;
          pSVar12 = (SrcEvaluatorType *)&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x2
          ;
        } while ((long)pSVar12 < (long)puVar19);
      }
      if ((long)puVar19 < (long)local_370._8_8_) {
        do {
          pdVar15[(long)puVar19] =
               local_388.m_data[(long)(puVar19 + local_388.m_rows * 0x2c)] * (double)local_228 +
               local_388.m_data[(long)(puVar19 + local_388.m_rows * 0x2a)];
          puVar19 = puVar19 + 1;
        } while ((undefined1 *)local_370._8_8_ != puVar19);
      }
      pdVar15 = (PointerType)(local_370._0_8_ + local_370._8_8_ * 0x58);
      pSVar12 = (SrcEvaluatorType *)local_370._8_8_;
      if ((((ulong)pdVar15 & 7) == 0) &&
         (pSVar12 = (SrcEvaluatorType *)(ulong)((uint)((ulong)pdVar15 >> 3) & 1),
         (long)local_370._8_8_ <= (long)pSVar12)) {
        pSVar12 = (SrcEvaluatorType *)local_370._8_8_;
      }
      if (0 < (long)pSVar12) {
        lVar10 = 0;
        do {
          pdVar15[lVar10] =
               local_388.m_data[lVar10 + local_388.m_rows * 0xc] * local_70[0] +
               local_388.m_data[lVar10 + local_388.m_rows * 0xb] * (double)local_228 +
               local_388.m_data[lVar10 + local_388.m_rows * 3];
          lVar10 = lVar10 + 1;
        } while (pSVar12 != (SrcEvaluatorType *)lVar10);
      }
      lVar10 = local_370._8_8_ - (long)pSVar12;
      puVar19 = &(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                (lVar10 - (lVar10 >> 0x3f) & 0xfffffffffffffffe);
      pSVar17 = pSVar12;
      if (1 < lVar10) {
        do {
          dVar3 = (local_388.m_data +
                  (long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                        local_388.m_rows * 3))[1];
          dVar4 = (local_388.m_data +
                  (long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                        local_388.m_rows * 0xb))[1];
          dVar5 = (local_388.m_data +
                  (long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                        local_388.m_rows * 0xc))[1];
          pdVar15[(long)pSVar17] =
               local_388.m_data
               [(long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      local_388.m_rows * 0xc)] * local_70[0] +
               local_388.m_data
               [(long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      local_388.m_rows * 0xb)] * (double)local_228 +
               local_388.m_data
               [(long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      local_388.m_rows * 3)];
          (pdVar15 + (long)pSVar17)[1] = dVar5 * local_70[0] + dVar4 * (double)local_228 + dVar3;
          pSVar17 = (SrcEvaluatorType *)&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x2
          ;
        } while ((long)pSVar17 < (long)puVar19);
      }
      if ((long)puVar19 < (long)local_370._8_8_) {
        lVar22 = lVar10 / 2;
        lVar18 = 0;
        do {
          *(double *)
           (local_370._0_8_ +
           lVar18 * 8 + local_370._8_8_ * 0x58 + lVar22 * 0x10 + (long)pSVar12 * 8) =
               local_388.m_data
               [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      lVar22 * 2 + local_388.m_rows * 0xc + lVar18)] * local_70[0] +
               local_388.m_data
               [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      lVar22 * 2 + local_388.m_rows * 0xb + lVar18)] * (double)local_228 +
               local_388.m_data
               [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      lVar22 * 2 + local_388.m_rows * 3 + lVar18)];
          lVar18 = lVar18 + 1;
        } while (lVar10 % 2 != lVar18);
      }
      pDVar11 = (DstEvaluatorType *)(local_370._0_8_ + local_370._8_8_ * 4 * 0x18);
      pSVar12 = (SrcEvaluatorType *)local_370._8_8_;
      if ((((ulong)pDVar11 & 7) == 0) &&
         (pSVar12 = (SrcEvaluatorType *)(ulong)((uint)((ulong)pDVar11 >> 3) & 1),
         (long)local_370._8_8_ <= (long)pSVar12)) {
        pSVar12 = (SrcEvaluatorType *)local_370._8_8_;
      }
      if (0 < (long)pSVar12) {
        lVar10 = 0;
        do {
          (&(pDVar11->
            super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>).
            super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
            .m_data)[lVar10] =
               (PointerType)
               (local_388.m_data[lVar10 + local_388.m_rows * 0x12] * local_70[0] +
               local_388.m_data[lVar10 + local_388.m_rows * 0x11] * (double)local_228 +
               local_388.m_data[lVar10 + local_388.m_rows * 0xd]);
          lVar10 = lVar10 + 1;
        } while (pSVar12 != (SrcEvaluatorType *)lVar10);
      }
      lVar10 = local_370._8_8_ - (long)pSVar12;
      puVar19 = &(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                (lVar10 - (lVar10 >> 0x3f) & 0xfffffffffffffffe);
      pSVar17 = pSVar12;
      if (1 < lVar10) {
        do {
          dVar3 = (local_388.m_data +
                  (long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                        local_388.m_rows * 0xd))[1];
          dVar4 = (local_388.m_data +
                  (long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                        local_388.m_rows * 0x11))[1];
          dVar5 = (local_388.m_data +
                  (long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                        local_388.m_rows * 0x12))[1];
          ppdVar1 = &(pDVar11->
                     super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                     ).
                     super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                     .m_data + (long)pSVar17;
          *ppdVar1 = (PointerType)
                     (local_388.m_data
                      [(long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                             local_388.m_rows * 0x12)] * local_70[0] +
                     local_388.m_data
                     [(long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                            local_388.m_rows * 0x11)] * (double)local_228 +
                     local_388.m_data
                     [(long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                            local_388.m_rows * 0xd)]);
          ppdVar1[1] = (PointerType)(dVar5 * local_70[0] + dVar4 * (double)local_228 + dVar3);
          pSVar17 = (SrcEvaluatorType *)&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x2
          ;
        } while ((long)pSVar17 < (long)puVar19);
      }
      if ((long)puVar19 < (long)local_370._8_8_) {
        lVar22 = lVar10 / 2;
        lVar18 = 0;
        do {
          (&(((DstEvaluatorType *)(local_370._0_8_ + local_370._8_8_ * 4 * 0x18))->
            super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>).
            super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
            .m_data)
          [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 + lVar22 * 2 + lVar18
                 )] = (PointerType)
                      (local_388.m_data
                       [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                              lVar22 * 2 + local_388.m_rows * 0x12 + lVar18)] * local_70[0] +
                      local_388.m_data
                      [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                             lVar22 * 2 + local_388.m_rows * 0x11 + lVar18)] * (double)local_228 +
                      local_388.m_data
                      [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                             lVar22 * 2 + local_388.m_rows * 0xd + lVar18)]);
          lVar18 = lVar18 + 1;
        } while (lVar10 % 2 != lVar18);
      }
      pdVar15 = (PointerType)(local_370._0_8_ + local_370._8_8_ * 0x68);
      pSVar12 = (SrcEvaluatorType *)local_370._8_8_;
      if ((((ulong)pdVar15 & 7) == 0) &&
         (pSVar12 = (SrcEvaluatorType *)(ulong)((uint)((ulong)pdVar15 >> 3) & 1),
         (long)local_370._8_8_ <= (long)pSVar12)) {
        pSVar12 = (SrcEvaluatorType *)local_370._8_8_;
      }
      if (0 < (long)pSVar12) {
        lVar10 = 0;
        do {
          pdVar15[lVar10] =
               local_388.m_data[lVar10 + local_388.m_rows * 0x1d] * local_70[0] +
               local_388.m_data[lVar10 + local_388.m_rows * 0x1c] * (double)local_228 +
               local_388.m_data[lVar10 + local_388.m_rows * 0x18];
          lVar10 = lVar10 + 1;
        } while (pSVar12 != (SrcEvaluatorType *)lVar10);
      }
      lVar10 = local_370._8_8_ - (long)pSVar12;
      puVar19 = &(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                (lVar10 - (lVar10 >> 0x3f) & 0xfffffffffffffffe);
      pSVar17 = pSVar12;
      if (1 < lVar10) {
        do {
          dVar3 = (local_388.m_data +
                  (long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                        local_388.m_rows * 0x18))[1];
          dVar4 = (local_388.m_data +
                  (long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                        local_388.m_rows * 0x1c))[1];
          dVar5 = (local_388.m_data +
                  (long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                        local_388.m_rows * 0x1d))[1];
          pdVar15[(long)pSVar17] =
               local_388.m_data
               [(long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      local_388.m_rows * 0x1d)] * local_70[0] +
               local_388.m_data
               [(long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      local_388.m_rows * 0x1c)] * (double)local_228 +
               local_388.m_data
               [(long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      local_388.m_rows * 0x18)];
          (pdVar15 + (long)pSVar17)[1] = dVar5 * local_70[0] + dVar4 * (double)local_228 + dVar3;
          pSVar17 = (SrcEvaluatorType *)&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x2
          ;
        } while ((long)pSVar17 < (long)puVar19);
      }
      if ((long)puVar19 < (long)local_370._8_8_) {
        lVar22 = lVar10 / 2;
        lVar18 = 0;
        do {
          *(double *)
           (local_370._0_8_ +
           lVar18 * 8 + local_370._8_8_ * 0x68 + lVar22 * 0x10 + (long)pSVar12 * 8) =
               local_388.m_data
               [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      lVar22 * 2 + local_388.m_rows * 0x1d + lVar18)] * local_70[0] +
               local_388.m_data
               [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      lVar22 * 2 + local_388.m_rows * 0x1c + lVar18)] * (double)local_228 +
               local_388.m_data
               [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      lVar22 * 2 + local_388.m_rows * 0x18 + lVar18)];
          lVar18 = lVar18 + 1;
        } while (lVar10 % 2 != lVar18);
      }
      pdVar15 = (PointerType)(local_370._0_8_ + local_370._8_8_ * 0x70);
      pSVar12 = (SrcEvaluatorType *)local_370._8_8_;
      if ((((ulong)pdVar15 & 7) == 0) &&
         (pSVar12 = (SrcEvaluatorType *)(ulong)((uint)((ulong)pdVar15 >> 3) & 1),
         (long)local_370._8_8_ <= (long)pSVar12)) {
        pSVar12 = (SrcEvaluatorType *)local_370._8_8_;
      }
      if (0 < (long)pSVar12) {
        lVar10 = 0;
        do {
          pdVar15[lVar10] =
               local_388.m_data[lVar10 + local_388.m_rows * 0x2f] * local_70[1] +
               local_388.m_data[lVar10 + local_388.m_rows * 0x2e] * local_70[0] +
               local_388.m_data[lVar10 + local_388.m_rows * 0x2d] * (double)local_228 +
               local_388.m_data[lVar10 + local_388.m_rows * 0x29];
          lVar10 = lVar10 + 1;
        } while (pSVar12 != (SrcEvaluatorType *)lVar10);
      }
      lVar10 = local_370._8_8_ - (long)pSVar12;
      puVar19 = &(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                (lVar10 - (lVar10 >> 0x3f) & 0xfffffffffffffffe);
      pSVar17 = pSVar12;
      if (1 < lVar10) {
        do {
          dVar3 = (local_388.m_data +
                  (long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                        local_388.m_rows * 0x29))[1];
          dVar4 = (local_388.m_data +
                  (long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                        local_388.m_rows * 0x2d))[1];
          dVar5 = (local_388.m_data +
                  (long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                        local_388.m_rows * 0x2e))[1];
          dVar6 = (local_388.m_data +
                  (long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                        local_388.m_rows * 0x2f))[1];
          pdVar15[(long)pSVar17] =
               local_388.m_data
               [(long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      local_388.m_rows * 0x2f)] * local_70[1] +
               local_388.m_data
               [(long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      local_388.m_rows * 0x2e)] * local_70[0] +
               local_388.m_data
               [(long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      local_388.m_rows * 0x2d)] * (double)local_228 +
               local_388.m_data
               [(long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      local_388.m_rows * 0x29)];
          (pdVar15 + (long)pSVar17)[1] =
               dVar6 * local_70[1] + dVar5 * local_70[0] + dVar4 * (double)local_228 + dVar3;
          pSVar17 = (SrcEvaluatorType *)&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x2
          ;
        } while ((long)pSVar17 < (long)puVar19);
      }
      if ((long)puVar19 < (long)local_370._8_8_) {
        lVar22 = lVar10 / 2;
        lVar18 = 0;
        do {
          *(double *)
           (local_370._0_8_ +
           lVar18 * 8 + local_370._8_8_ * 0x70 + lVar22 * 0x10 + (long)pSVar12 * 8) =
               local_388.m_data
               [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      lVar22 * 2 + local_388.m_rows * 0x2f + lVar18)] * local_70[1] +
               local_388.m_data
               [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      lVar22 * 2 + local_388.m_rows * 0x2e + lVar18)] * local_70[0] +
               local_388.m_data
               [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      lVar22 * 2 + local_388.m_rows * 0x2d + lVar18)] * (double)local_228 +
               local_388.m_data
               [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      lVar22 * 2 + local_388.m_rows * 0x29 + lVar18)];
          lVar18 = lVar18 + 1;
        } while (lVar10 % 2 != lVar18);
      }
      pDVar11 = (DstEvaluatorType *)(local_370._0_8_ + local_370._8_8_ * 5 * 0x18);
      pSVar12 = (SrcEvaluatorType *)local_370._8_8_;
      if ((((ulong)pDVar11 & 7) == 0) &&
         (pSVar12 = (SrcEvaluatorType *)(ulong)((uint)((ulong)pDVar11 >> 3) & 1),
         (long)local_370._8_8_ <= (long)pSVar12)) {
        pSVar12 = (SrcEvaluatorType *)local_370._8_8_;
      }
      if (0 < (long)pSVar12) {
        lVar10 = 0;
        do {
          (&(pDVar11->
            super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>).
            super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
            .m_data)[lVar10] =
               (PointerType)
               (local_388.m_data[lVar10 + local_388.m_rows * 0x16] * local_70[2] +
               local_388.m_data[lVar10 + local_388.m_rows * 0x15] * local_70[1] +
               local_388.m_data[lVar10 + local_388.m_rows * 0x14] * local_70[0] +
               local_388.m_data[lVar10 + local_388.m_rows * 0x13] * (double)local_228 +
               local_388.m_data[lVar10 + local_388.m_rows * 2]);
          lVar10 = lVar10 + 1;
        } while (pSVar12 != (SrcEvaluatorType *)lVar10);
      }
      lVar10 = local_370._8_8_ - (long)pSVar12;
      puVar19 = &(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                (lVar10 - (lVar10 >> 0x3f) & 0xfffffffffffffffe);
      pSVar17 = pSVar12;
      if (1 < lVar10) {
        do {
          dVar3 = (local_388.m_data +
                  (long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                        local_388.m_rows * 2))[1];
          dVar4 = (local_388.m_data +
                  (long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                        local_388.m_rows * 0x13))[1];
          dVar5 = (local_388.m_data +
                  (long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                        local_388.m_rows * 0x14))[1];
          dVar6 = (local_388.m_data +
                  (long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                        local_388.m_rows * 0x15))[1];
          dVar7 = (local_388.m_data +
                  (long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                        local_388.m_rows * 0x16))[1];
          ppdVar1 = &(pDVar11->
                     super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                     ).
                     super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                     .m_data + (long)pSVar17;
          *ppdVar1 = (PointerType)
                     (local_388.m_data
                      [(long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                             local_388.m_rows * 0x16)] * local_70[2] +
                     local_388.m_data
                     [(long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                            local_388.m_rows * 0x15)] * local_70[1] +
                     local_388.m_data
                     [(long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                            local_388.m_rows * 0x14)] * local_70[0] +
                     local_388.m_data
                     [(long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                            local_388.m_rows * 0x13)] * (double)local_228 +
                     local_388.m_data
                     [(long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                            local_388.m_rows * 2)]);
          ppdVar1[1] = (PointerType)
                       (dVar7 * local_70[2] +
                       dVar6 * local_70[1] + dVar5 * local_70[0] + dVar4 * (double)local_228 + dVar3
                       );
          pSVar17 = (SrcEvaluatorType *)&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x2
          ;
        } while ((long)pSVar17 < (long)puVar19);
      }
      if ((long)puVar19 < (long)local_370._8_8_) {
        lVar22 = lVar10 / 2;
        lVar18 = 0;
        do {
          (&(((DstEvaluatorType *)(local_370._0_8_ + local_370._8_8_ * 5 * 0x18))->
            super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>).
            super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
            .m_data)
          [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 + lVar22 * 2 + lVar18
                 )] = (PointerType)
                      (local_388.m_data
                       [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                              lVar22 * 2 + local_388.m_rows * 0x16 + lVar18)] * local_70[2] +
                      local_388.m_data
                      [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                             lVar22 * 2 + local_388.m_rows * 0x15 + lVar18)] * local_70[1] +
                      local_388.m_data
                      [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                             lVar22 * 2 + local_388.m_rows * 0x14 + lVar18)] * local_70[0] +
                      local_388.m_data
                      [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                             lVar22 * 2 + local_388.m_rows * 0x13 + lVar18)] * (double)local_228 +
                      local_388.m_data
                      [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                             lVar22 * 2 + local_388.m_rows * 2 + lVar18)]);
          lVar18 = lVar18 + 1;
        } while (lVar10 % 2 != lVar18);
      }
      pdVar15 = (PointerType)(local_370._0_8_ + local_370._8_8_ * 0x80);
      pSVar12 = (SrcEvaluatorType *)local_370._8_8_;
      if ((((ulong)pdVar15 & 7) == 0) &&
         (pSVar12 = (SrcEvaluatorType *)(ulong)((uint)((ulong)pdVar15 >> 3) & 1),
         (long)local_370._8_8_ <= (long)pSVar12)) {
        pSVar12 = (SrcEvaluatorType *)local_370._8_8_;
      }
      if (0 < (long)pSVar12) {
        lVar10 = 0;
        do {
          pdVar15[lVar10] =
               local_388.m_data[lVar10 + local_388.m_rows * 0x21] * local_70[2] +
               local_388.m_data[lVar10 + local_388.m_rows * 0x20] * local_70[1] +
               local_388.m_data[lVar10 + local_388.m_rows * 0x1f] * local_70[0] +
               local_388.m_data[lVar10 + local_388.m_rows * 0x1e] * (double)local_228 +
               local_388.m_data[lVar10 + local_388.m_rows * 0x17];
          lVar10 = lVar10 + 1;
        } while (pSVar12 != (SrcEvaluatorType *)lVar10);
      }
      lVar10 = local_370._8_8_ - (long)pSVar12;
      puVar19 = &(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                (lVar10 - (lVar10 >> 0x3f) & 0xfffffffffffffffe);
      pSVar17 = pSVar12;
      if (1 < lVar10) {
        do {
          dVar3 = (local_388.m_data +
                  (long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                        local_388.m_rows * 0x17))[1];
          dVar4 = (local_388.m_data +
                  (long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                        local_388.m_rows * 0x1e))[1];
          dVar5 = (local_388.m_data +
                  (long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                        local_388.m_rows * 0x1f))[1];
          dVar6 = (local_388.m_data +
                  (long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                        local_388.m_rows * 0x20))[1];
          dVar7 = (local_388.m_data +
                  (long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                        local_388.m_rows * 0x21))[1];
          pdVar15[(long)pSVar17] =
               local_388.m_data
               [(long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      local_388.m_rows * 0x21)] * local_70[2] +
               local_388.m_data
               [(long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      local_388.m_rows * 0x20)] * local_70[1] +
               local_388.m_data
               [(long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      local_388.m_rows * 0x1f)] * local_70[0] +
               local_388.m_data
               [(long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      local_388.m_rows * 0x1e)] * (double)local_228 +
               local_388.m_data
               [(long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      local_388.m_rows * 0x17)];
          (pdVar15 + (long)pSVar17)[1] =
               dVar7 * local_70[2] +
               dVar6 * local_70[1] + dVar5 * local_70[0] + dVar4 * (double)local_228 + dVar3;
          pSVar17 = (SrcEvaluatorType *)&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x2
          ;
        } while ((long)pSVar17 < (long)puVar19);
      }
      if ((long)puVar19 < (long)local_370._8_8_) {
        lVar22 = lVar10 / 2;
        lVar18 = 0;
        do {
          *(double *)
           (local_370._0_8_ +
           lVar18 * 8 + local_370._8_8_ * 0x80 + lVar22 * 0x10 + (long)pSVar12 * 8) =
               local_388.m_data
               [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      lVar22 * 2 + local_388.m_rows * 0x21 + lVar18)] * local_70[2] +
               local_388.m_data
               [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      lVar22 * 2 + local_388.m_rows * 0x20 + lVar18)] * local_70[1] +
               local_388.m_data
               [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      lVar22 * 2 + local_388.m_rows * 0x1f + lVar18)] * local_70[0] +
               local_388.m_data
               [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      lVar22 * 2 + local_388.m_rows * 0x1e + lVar18)] * (double)local_228 +
               local_388.m_data
               [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      lVar22 * 2 + local_388.m_rows * 0x17 + lVar18)];
          lVar18 = lVar18 + 1;
        } while (lVar10 % 2 != lVar18);
      }
      pdVar15 = (PointerType)(local_370._0_8_ + local_370._8_8_ * 0x88);
      pSVar12 = (SrcEvaluatorType *)local_370._8_8_;
      if ((((ulong)pdVar15 & 7) == 0) &&
         (pSVar12 = (SrcEvaluatorType *)(ulong)((uint)((ulong)pdVar15 >> 3) & 1),
         (long)local_370._8_8_ <= (long)pSVar12)) {
        pSVar12 = (SrcEvaluatorType *)local_370._8_8_;
      }
      if (0 < (long)pSVar12) {
        lVar10 = 0;
        do {
          pdVar15[lVar10] =
               local_388.m_data[lVar10 + local_388.m_rows * 0x33] * local_70[2] +
               local_388.m_data[lVar10 + local_388.m_rows * 0x32] * local_70[1] +
               local_388.m_data[lVar10 + local_388.m_rows * 0x31] * local_70[0] +
               local_388.m_data[lVar10 + local_388.m_rows * 0x30] * (double)local_228 +
               local_388.m_data[lVar10 + local_388.m_rows * 0x28];
          lVar10 = lVar10 + 1;
        } while (pSVar12 != (SrcEvaluatorType *)lVar10);
      }
      lVar10 = local_370._8_8_ - (long)pSVar12;
      puVar19 = &(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                (lVar10 - (lVar10 >> 0x3f) & 0xfffffffffffffffe);
      pSVar17 = pSVar12;
      if (1 < lVar10) {
        do {
          dVar3 = (local_388.m_data +
                  (long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                        local_388.m_rows * 0x28))[1];
          dVar4 = (local_388.m_data +
                  (long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                        local_388.m_rows * 0x30))[1];
          dVar5 = (local_388.m_data +
                  (long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                        local_388.m_rows * 0x31))[1];
          dVar6 = (local_388.m_data +
                  (long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                        local_388.m_rows * 0x32))[1];
          dVar7 = (local_388.m_data +
                  (long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                        local_388.m_rows * 0x33))[1];
          pdVar15[(long)pSVar17] =
               local_388.m_data
               [(long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      local_388.m_rows * 0x33)] * local_70[2] +
               local_388.m_data
               [(long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      local_388.m_rows * 0x32)] * local_70[1] +
               local_388.m_data
               [(long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      local_388.m_rows * 0x31)] * local_70[0] +
               local_388.m_data
               [(long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      local_388.m_rows * 0x30)] * (double)local_228 +
               local_388.m_data
               [(long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      local_388.m_rows * 0x28)];
          (pdVar15 + (long)pSVar17)[1] =
               dVar7 * local_70[2] +
               dVar6 * local_70[1] + dVar5 * local_70[0] + dVar4 * (double)local_228 + dVar3;
          pSVar17 = (SrcEvaluatorType *)&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x2
          ;
        } while ((long)pSVar17 < (long)puVar19);
      }
      if ((long)puVar19 < (long)local_370._8_8_) {
        lVar22 = lVar10 / 2;
        lVar18 = 0;
        do {
          *(double *)
           (local_370._0_8_ +
           lVar18 * 8 + local_370._8_8_ * 0x88 + lVar22 * 0x10 + (long)pSVar12 * 8) =
               local_388.m_data
               [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      lVar22 * 2 + local_388.m_rows * 0x33 + lVar18)] * local_70[2] +
               local_388.m_data
               [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      lVar22 * 2 + local_388.m_rows * 0x32 + lVar18)] * local_70[1] +
               local_388.m_data
               [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      lVar22 * 2 + local_388.m_rows * 0x31 + lVar18)] * local_70[0] +
               local_388.m_data
               [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      lVar22 * 2 + local_388.m_rows * 0x30 + lVar18)] * (double)local_228 +
               local_388.m_data
               [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      lVar22 * 2 + local_388.m_rows * 0x28 + lVar18)];
          lVar18 = lVar18 + 1;
        } while (lVar10 % 2 != lVar18);
      }
      pDVar11 = (DstEvaluatorType *)(local_370._0_8_ + local_370._8_8_ * 6 * 0x18);
      pSVar12 = (SrcEvaluatorType *)local_370._8_8_;
      if ((((ulong)pDVar11 & 7) == 0) &&
         (pSVar12 = (SrcEvaluatorType *)(ulong)((uint)((ulong)pDVar11 >> 3) & 1),
         (long)local_370._8_8_ <= (long)pSVar12)) {
        pSVar12 = (SrcEvaluatorType *)local_370._8_8_;
      }
      if (0 < (long)pSVar12) {
        lVar10 = 0;
        do {
          (&(pDVar11->
            super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>).
            super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
            .m_data)[lVar10] =
               (PointerType)
               (local_388.m_data[lVar10 + local_388.m_rows * 0x26] * local_70[3] +
               local_388.m_data[lVar10 + local_388.m_rows * 0x25] * local_70[2] +
               local_388.m_data[lVar10 + local_388.m_rows * 0x24] * local_70[1] +
               local_388.m_data[lVar10 + local_388.m_rows * 0x23] * local_70[0] +
               local_388.m_data[lVar10 + local_388.m_rows * 0x22] * (double)local_228 +
               local_388.m_data[local_388.m_rows + lVar10]);
          lVar10 = lVar10 + 1;
        } while (pSVar12 != (SrcEvaluatorType *)lVar10);
      }
      lVar10 = local_370._8_8_ - (long)pSVar12;
      puVar19 = &(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                (lVar10 - (lVar10 >> 0x3f) & 0xfffffffffffffffe);
      pSVar17 = pSVar12;
      if (1 < lVar10) {
        do {
          dVar3 = (local_388.m_data + local_388.m_rows + (long)pSVar17)[1];
          dVar4 = (local_388.m_data +
                  (long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                        local_388.m_rows * 0x22))[1];
          dVar5 = (local_388.m_data +
                  (long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                        local_388.m_rows * 0x23))[1];
          dVar6 = (local_388.m_data +
                  (long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                        local_388.m_rows * 0x24))[1];
          dVar7 = (local_388.m_data +
                  (long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                        local_388.m_rows * 0x25))[1];
          dVar8 = (local_388.m_data +
                  (long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                        local_388.m_rows * 0x26))[1];
          ppdVar1 = &(pDVar11->
                     super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                     ).
                     super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                     .m_data + (long)pSVar17;
          *ppdVar1 = (PointerType)
                     (local_388.m_data
                      [(long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                             local_388.m_rows * 0x26)] * local_70[3] +
                     local_388.m_data
                     [(long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                            local_388.m_rows * 0x25)] * local_70[2] +
                     local_388.m_data
                     [(long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                            local_388.m_rows * 0x24)] * local_70[1] +
                     local_388.m_data
                     [(long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                            local_388.m_rows * 0x23)] * local_70[0] +
                     local_388.m_data
                     [(long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                            local_388.m_rows * 0x22)] * (double)local_228 +
                     local_388.m_data[local_388.m_rows + (long)pSVar17]);
          ppdVar1[1] = (PointerType)
                       (dVar8 * local_70[3] +
                       dVar7 * local_70[2] +
                       dVar6 * local_70[1] + dVar5 * local_70[0] + dVar4 * (double)local_228 + dVar3
                       );
          pSVar17 = (SrcEvaluatorType *)&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x2
          ;
        } while ((long)pSVar17 < (long)puVar19);
      }
      if ((long)puVar19 < (long)local_370._8_8_) {
        lVar18 = lVar10 / 2;
        lVar22 = 0;
        do {
          (&(((DstEvaluatorType *)(local_370._0_8_ + local_370._8_8_ * 6 * 0x18))->
            super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>).
            super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
            .m_data)
          [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 + lVar18 * 2 + lVar22
                 )] = (PointerType)
                      (local_388.m_data
                       [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                              lVar18 * 2 + local_388.m_rows * 0x26 + lVar22)] * local_70[3] +
                      local_388.m_data
                      [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                             lVar18 * 2 + local_388.m_rows * 0x25 + lVar22)] * local_70[2] +
                      local_388.m_data
                      [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                             lVar18 * 2 + local_388.m_rows * 0x24 + lVar22)] * local_70[1] +
                      local_388.m_data
                      [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                             lVar18 * 2 + local_388.m_rows * 0x23 + lVar22)] * local_70[0] +
                      local_388.m_data
                      [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                             lVar18 * 2 + local_388.m_rows * 0x22 + lVar22)] * (double)local_228 +
                      local_388.m_data
                      [(long)(local_388.m_rows +
                             (long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                                   lVar18 * 2 + lVar22))]);
          lVar22 = lVar22 + 1;
        } while (lVar10 % 2 != lVar22);
      }
      pdVar15 = (PointerType)(local_370._0_8_ + local_370._8_8_ * 0x98);
      pSVar12 = (SrcEvaluatorType *)local_370._8_8_;
      if ((((ulong)pdVar15 & 7) == 0) &&
         (pSVar12 = (SrcEvaluatorType *)(ulong)((uint)((ulong)pdVar15 >> 3) & 1),
         (long)local_370._8_8_ <= (long)pSVar12)) {
        pSVar12 = (SrcEvaluatorType *)local_370._8_8_;
      }
      local_370._40_8_ = local_388.m_rows * 0x1b0;
      local_2b0 = local_388.m_rows * 0x1b8;
      local_2b8 = local_388.m_rows * 0x1c0;
      if (0 < (long)pSVar12) {
        lVar10 = 0;
        do {
          pdVar15[lVar10] =
               local_388.m_data[lVar10 + local_388.m_rows * 0x38] * local_70[3] +
               local_388.m_data[lVar10 + local_388.m_rows * 0x37] * local_70[2] +
               local_388.m_data[lVar10 + local_388.m_rows * 0x36] * local_70[1] +
               local_388.m_data[lVar10 + local_388.m_rows * 0x35] * local_70[0] +
               local_388.m_data[lVar10 + local_388.m_rows * 0x34] * (double)local_228 +
               local_388.m_data[lVar10 + local_388.m_rows * 0x27];
          lVar10 = lVar10 + 1;
        } while (pSVar12 != (SrcEvaluatorType *)lVar10);
      }
      lVar10 = local_370._8_8_ - (long)pSVar12;
      puVar19 = &(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                (lVar10 - (lVar10 >> 0x3f) & 0xfffffffffffffffe);
      pSVar17 = pSVar12;
      if (1 < lVar10) {
        do {
          dVar3 = (local_388.m_data +
                  (long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                        local_388.m_rows * 0x27))[1];
          dVar4 = (local_388.m_data +
                  (long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                        local_388.m_rows * 0x34))[1];
          dVar5 = (local_388.m_data +
                  (long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                        local_388.m_rows * 0x35))[1];
          dVar6 = (local_388.m_data +
                  (long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                        local_388.m_rows * 0x36))[1];
          dVar7 = (local_388.m_data +
                  (long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                        local_388.m_rows * 0x37))[1];
          dVar8 = (local_388.m_data +
                  (long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                        local_388.m_rows * 0x38))[1];
          pdVar15[(long)pSVar17] =
               local_388.m_data
               [(long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      local_388.m_rows * 0x38)] * local_70[3] +
               local_388.m_data
               [(long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      local_388.m_rows * 0x37)] * local_70[2] +
               local_388.m_data
               [(long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      local_388.m_rows * 0x36)] * local_70[1] +
               local_388.m_data
               [(long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      local_388.m_rows * 0x35)] * local_70[0] +
               local_388.m_data
               [(long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      local_388.m_rows * 0x34)] * (double)local_228 +
               local_388.m_data
               [(long)(&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      local_388.m_rows * 0x27)];
          (pdVar15 + (long)pSVar17)[1] =
               dVar8 * local_70[3] +
               dVar7 * local_70[2] +
               dVar6 * local_70[1] + dVar5 * local_70[0] + dVar4 * (double)local_228 + dVar3;
          pSVar17 = (SrcEvaluatorType *)&(pSVar17->super_binary_evaluator<_8af2730d_>).m_d.field_0x2
          ;
        } while ((long)pSVar17 < (long)puVar19);
      }
      if ((long)puVar19 < (long)local_370._8_8_) {
        lVar22 = lVar10 / 2;
        lVar18 = 0;
        do {
          *(double *)
           (local_370._0_8_ +
           lVar18 * 8 + local_370._8_8_ * 0x98 + lVar22 * 0x10 + (long)pSVar12 * 8) =
               local_388.m_data
               [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      lVar22 * 2 + local_388.m_rows * 0x38 + lVar18)] * local_70[3] +
               local_388.m_data
               [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      lVar22 * 2 + local_388.m_rows * 0x37 + lVar18)] * local_70[2] +
               local_388.m_data
               [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      lVar22 * 2 + local_388.m_rows * 0x36 + lVar18)] * local_70[1] +
               local_388.m_data
               [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      lVar22 * 2 + local_388.m_rows * 0x35 + lVar18)] * local_70[0] +
               local_388.m_data
               [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      lVar22 * 2 + local_388.m_rows * 0x34 + lVar18)] * (double)local_228 +
               local_388.m_data
               [(long)(&(pSVar12->super_binary_evaluator<_8af2730d_>).m_d.field_0x0 +
                      lVar22 * 2 + local_388.m_rows * 0x27 + lVar18)];
          lVar18 = lVar18 + 1;
        } while (lVar10 % 2 != lVar18);
      }
      local_218._104_8_ = local_388.m_data + local_388.m_rows * 0x39;
      local_180 = local_388.m_data + local_388.m_rows * 0x3a;
      local_150 = local_388.m_data + local_388.m_rows * 0x3b;
      local_120 = local_388.m_data + local_388.m_rows * 0x3c;
      local_f0 = local_388.m_data + local_388.m_rows * 0x3d;
      local_c0 = local_388.m_data + local_388.m_rows * 0x3e;
      local_90 = local_388.m_data + local_388.m_rows * 0x3f;
      local_218._56_8_ = local_388.m_data;
      local_218._72_8_ = local_388.m_rows;
      local_218._88_8_ = local_228;
      local_218._120_8_ = local_388.m_rows;
      local_190 = local_70[0];
      local_170 = (double *)local_388.m_rows;
      local_160 = local_70[1];
      local_140 = (double *)local_388.m_rows;
      local_130 = local_70[2];
      local_110 = (double *)local_388.m_rows;
      local_100 = local_70[3];
      local_e0 = (double *)local_388.m_rows;
      local_d0 = local_70[4];
      local_b0 = (double *)local_388.m_rows;
      local_a0 = local_70[5];
      local_80 = (double *)local_388.m_rows;
      local_318.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data =
           (PointerType)(local_370._8_8_ * 0xa0 + local_370._0_8_);
      local_318.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_rows.
      m_value = local_370._8_8_;
      local_318.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_startRow.
      m_value = 0;
      local_318.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_startCol.
      m_value = 0x14;
      local_318.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      m_outerStride = local_370._8_8_;
      local_2a8.super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
      .m_outerStride.m_value = local_370._8_8_;
      local_260.m_dst = &local_2a8;
      local_260.m_functor = (assign_op<double,_double> *)&local_270;
      local_2d8 = local_70[0];
      uStack_2d0 = 0;
      local_338 = local_70[1];
      uStack_330 = 0;
      local_328 = local_70[2];
      uStack_320 = 0;
      local_370._24_8_ = local_70[3];
      local_370._32_8_ = 0;
      local_318.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_xpr =
           (XprTypeNested)local_370;
      local_2a8.super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
      .m_data = local_318.m_xpr.
                super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                .
                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                .m_data;
      local_260.m_src = (SrcEvaluatorType *)local_218;
      local_260.m_dstExpr = &local_318.m_xpr;
      Eigen::internal::dense_assignment_loop<$b2a47d00$>::run(&local_260);
      (((block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true> *)
       local_370._0_8_)->
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
      ).m_data = (PointerType)
                 ((double)(((block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                             *)local_370._0_8_)->
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                          ).m_data - (double)local_228);
      *(double *)
       (&(((block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true> *)
          local_370._0_8_)->
         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
         ).field_0x8 + local_370._8_8_ * 8) =
           *(double *)
            (&(((block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true> *)
               local_370._0_8_)->
              super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              ).field_0x8 + local_370._8_8_ * 8) - (double)local_228;
      (&(((DstEvaluatorType *)(local_370._0_8_ + 0x18))->
        super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>).
        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
        .m_data)[local_370._8_8_ * 2] =
           (PointerType)
           ((double)(&(((DstEvaluatorType *)(local_370._0_8_ + 0x18))->
                      super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                      ).
                      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                      .m_data)[local_370._8_8_ * 2] - (double)local_228);
      (((DstEvaluatorType *)
       (local_370._0_8_ + &(((binary_evaluator<_8af2730d_> *)local_370._8_8_)->m_d).field_0x2 * 0x18
       ))->super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>).
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
      .m_data = (PointerType)
                ((double)(((DstEvaluatorType *)
                          (local_370._0_8_ +
                          &(((binary_evaluator<_8af2730d_> *)local_370._8_8_)->m_d).field_0x2 * 0x18
                          ))->
                         super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                         ).
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                         .m_data - (double)local_228);
      *(double *)(local_370._0_8_ + local_370._8_8_ * 0x20 + 0x50) =
           *(double *)(local_370._0_8_ + local_370._8_8_ * 0x20 + 0x50) - (double)local_228;
      *(double *)(local_370._0_8_ + local_370._8_8_ * 0x28 + 0x78) =
           *(double *)(local_370._0_8_ + local_370._8_8_ * 0x28 + 0x78) - (double)local_228;
      (((DstEvaluatorType *)(local_370._0_8_ + local_370._8_8_ * 2 * 0x18))->
      super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>).
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
      .m_outerStride.m_value =
           (long)((double)(((DstEvaluatorType *)(local_370._0_8_ + local_370._8_8_ * 2 * 0x18))->
                          super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                          ).
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                          .m_outerStride.m_value - local_2d8);
      *(double *)(local_370._0_8_ + local_370._8_8_ * 0x38 + 0x20) =
           *(double *)(local_370._0_8_ + local_370._8_8_ * 0x38 + 0x20) - local_2d8;
      *(double *)(local_370._0_8_ + local_370._8_8_ * 0x40 + 0x38) =
           *(double *)(local_370._0_8_ + local_370._8_8_ * 0x40 + 0x38) - local_2d8;
      (((DstEvaluatorType *)(local_370._0_8_ + (local_370._8_8_ * 3 + 3) * 0x18))->
      super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>).
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
      .m_outerStride.m_value =
           (long)((double)(((DstEvaluatorType *)(local_370._0_8_ + (local_370._8_8_ * 3 + 3) * 0x18)
                           )->
                          super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                          ).
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                          .m_outerStride.m_value - local_2d8);
      *(double *)(local_370._0_8_ + local_370._8_8_ * 0x50 + 0x80) =
           *(double *)(local_370._0_8_ + local_370._8_8_ * 0x50 + 0x80) - local_2d8;
      *(double *)(local_370._0_8_ + local_370._8_8_ * 0x58 + 0x28) =
           *(double *)(local_370._0_8_ + local_370._8_8_ * 0x58 + 0x28) - local_338;
      (((DstEvaluatorType *)(local_370._0_8_ + (local_370._8_8_ * 4 + 2) * 0x18))->
      super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>).
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
      .m_outerStride.m_value =
           (long)((double)(((DstEvaluatorType *)(local_370._0_8_ + (local_370._8_8_ * 4 + 2) * 0x18)
                           )->
                          super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                          ).
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                          .m_outerStride.m_value - local_338);
      *(double *)(local_370._0_8_ + local_370._8_8_ * 0x68 + 0x60) =
           *(double *)(local_370._0_8_ + local_370._8_8_ * 0x68 + 0x60) - local_338;
      *(double *)(local_370._0_8_ + local_370._8_8_ * 0x70 + 0x88) =
           *(double *)(local_370._0_8_ + local_370._8_8_ * 0x70 + 0x88) - local_328;
      (((DstEvaluatorType *)(local_370._0_8_ + (local_370._8_8_ * 5 + 3) * 0x18))->
      super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>).
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
      .m_data = (PointerType)
                ((double)(((DstEvaluatorType *)(local_370._0_8_ + (local_370._8_8_ * 5 + 3) * 0x18))
                         ->
                         super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                         ).
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                         .m_data - (double)local_370._24_8_);
      *(double *)(local_370._0_8_ + local_370._8_8_ * 0x80 + 0x68) =
           *(double *)(local_370._0_8_ + local_370._8_8_ * 0x80 + 0x68) - (double)local_370._24_8_;
      *(double *)(local_370._0_8_ + local_370._8_8_ * 0x88 + 0x90) =
           *(double *)(local_370._0_8_ + local_370._8_8_ * 0x88 + 0x90) - (double)local_370._24_8_;
      (((DstEvaluatorType *)(local_370._0_8_ + (local_370._8_8_ * 6 + 4) * 0x18))->
      super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>).
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
      .m_outerStride.m_value =
           (long)((double)(((DstEvaluatorType *)(local_370._0_8_ + (local_370._8_8_ * 6 + 4) * 0x18)
                           )->
                          super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                          ).
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                          .m_outerStride.m_value - dVar9);
      *(double *)(local_370._0_8_ + local_370._8_8_ * 0x98 + 0x98) =
           *(double *)(local_370._0_8_ + local_370._8_8_ * 0x98 + 0x98) - dVar9;
      *(double *)(local_370._0_8_ + local_370._8_8_ * 0xa0 + 0xa0) =
           *(double *)(local_370._0_8_ + local_370._8_8_ * 0xa0 + 0xa0) - local_70[6];
      local_260.m_dst = (DstEvaluatorType *)local_370._0_8_;
      local_260.m_src = (SrcEvaluatorType *)local_370._8_8_;
      local_260.m_functor = (assign_op<double,_double> *)0x14;
      local_240 = 0;
      uStack_238 = 0;
      local_230 = (SrcEvaluatorType *)local_370._8_8_;
      local_260.m_dstExpr = (DstXprType *)local_370;
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>_>::
      colPivHouseholderQr((ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                          local_218,
                          (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>_>
                           *)&local_260);
      local_318.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data =
           (PointerType)(local_370._8_8_ * 0xa0 + local_370._0_8_);
      local_318.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_rows.
      m_value = local_370._8_8_;
      local_318.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_startRow.
      m_value = 0;
      local_318.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_startCol.
      m_value = 0x14;
      local_318.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      m_outerStride = local_370._8_8_;
      local_2a8.super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
      .m_data = (PointerType)0x0;
      local_2a8.super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
      ._8_8_ = 0;
      local_318.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_xpr =
           (XprTypeNested)local_370;
      local_270.m_dec = (ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_218;
      local_270.m_rhs = &local_318;
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_2a8,
                 local_218._16_8_,1);
      Eigen::internal::
      Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
      ::run((Matrix<double,__1,_1,_0,__1,_1> *)&local_2a8,&local_270,
            (assign_op<double,_double> *)(local_370 + 0x37));
      free((void *)local_218._104_8_);
      free((void *)local_218._88_8_);
      free((void *)local_218._72_8_);
      free((void *)local_218._56_8_);
      free((void *)local_218._40_8_);
      free((void *)local_218._24_8_);
      free((void *)local_218._0_8_);
      local_218._0_8_ =
           local_2a8.
           super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
           .m_data[0x12];
      local_218._8_8_ =
           local_2a8.
           super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
           .m_data[0x13];
      local_218._16_8_ = local_78;
      __position._M_current = *(Matrix<double,_3,_1,_0,_3,_1> **)(local_2c0 + 8);
      if (__position._M_current == *(Matrix<double,_3,_1,_0,_3,_1> **)(local_2c0 + 0x10)) {
        std::vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>
        ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>
                  (local_2c0,__position,(Matrix<double,_3,_1,_0,_3,_1> *)local_218);
      }
      else {
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
        m_storage.m_data.array[2] = (double)local_78;
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
        m_storage.m_data.array[0] = (double)local_218._0_8_;
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
        m_storage.m_data.array[1] = (double)local_218._8_8_;
        *(long *)(local_2c0 + 8) = *(long *)(local_2c0 + 8) + 0x18;
      }
      free(local_2a8.
           super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
           .m_data);
      free((void *)local_370._0_8_);
      uVar13 = local_278 + 1;
    } while (uVar13 != local_288);
  }
  free(local_388.m_data);
  return (vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          *)local_2c0;
}

Assistant:

std::vector<Eigen::Vector3d> solve_xy_from_AM(double * z, int nroots, Eigen::MatrixXd AM) {
	int ind[] = { 5, 6, 7, 9, 10, 12, 15, 16, 18, 22, 26, 27, 29, 33, 38, 43, 44, 47, 51, 56, 63 };
	Eigen::MatrixXd AMs(21, 64);
	double zi[8];
	std::vector<Eigen::Vector3d> sols;
	for (int i = 0; i < 21; i++)
	{
		AMs.row(i) = AM.row(ind[i]);
	}
	for (int i = 0; i < nroots; i++)
	{
		zi[0] = z[i];
		for (int j = 1; j < 8; j++)
		{
			zi[j] = zi[j - 1] * z[i];
		}
		Eigen::MatrixXd AA = Eigen::MatrixXd::Zero(21, 21);
		AA.col(0) = AMs.col(5);
		AA.col(1) = AMs.col(6);
		AA.col(2) = AMs.col(9);
		AA.col(3) = AMs.col(15);
		AA.col(4) = AMs.col(26);
		AA.col(5) = AMs.col(43);
		AA.col(6) = AMs.col(4) + zi[0] * AMs.col(7);
		AA.col(7) = AMs.col(8) + zi[0] * AMs.col(10);
		AA.col(8) = AMs.col(14) + zi[0] * AMs.col(16);
		AA.col(9) = AMs.col(25) + zi[0] * AMs.col(27);
		AA.col(10) = AMs.col(42) + zi[0] * AMs.col(44);
		AA.col(11) = AMs.col(3) + zi[0] * AMs.col(11) + zi[1] * AMs.col(12);
		AA.col(12) = AMs.col(13) + zi[0] * AMs.col(17) + zi[1] * AMs.col(18);
		AA.col(13) = AMs.col(24) + zi[0] * AMs.col(28) + zi[1] * AMs.col(29);
		AA.col(14) = AMs.col(41) + zi[0] * AMs.col(45) + zi[1] * AMs.col(46) + zi[2] * AMs.col(47);
		AA.col(15) = AMs.col(2) + zi[0] * AMs.col(19) + zi[1] * AMs.col(20) + zi[2] * AMs.col(21) + zi[3] * AMs.col(22);
		AA.col(16) = AMs.col(23) + zi[0] * AMs.col(30) + zi[1] * AMs.col(31) + zi[2] * AMs.col(32) + zi[3] * AMs.col(33);
		AA.col(17) = AMs.col(40) + zi[0] * AMs.col(48) + zi[1] * AMs.col(49) + zi[2] * AMs.col(50) + zi[3] * AMs.col(51);
		AA.col(18) = AMs.col(1) + zi[0] * AMs.col(34) + zi[1] * AMs.col(35) + zi[2] * AMs.col(36) + zi[3] * AMs.col(37) + zi[4] * AMs.col(38);
		AA.col(19) = AMs.col(39) + zi[0] * AMs.col(52) + zi[1] * AMs.col(53) + zi[2] * AMs.col(54) + zi[3] * AMs.col(55) + zi[4] * AMs.col(56);
		AA.col(20) = AMs.col(0) + zi[0] * AMs.col(57) + zi[1] * AMs.col(58) + zi[2] * AMs.col(59) + zi[3] * AMs.col(60) + zi[4] * AMs.col(61) + zi[5] * AMs.col(62) + zi[6] * AMs.col(63);
		AA(0, 0) = AA(0, 0) - zi[0];
		AA(1, 1) = AA(1, 1) - zi[0];
		AA(3, 2) = AA(3, 2) - zi[0];
		AA(6, 3) = AA(6, 3) - zi[0];
		AA(10, 4) = AA(10, 4) - zi[0];
		AA(15, 5) = AA(15, 5) - zi[0];
		AA(2, 6) = AA(2, 6) - zi[1];
		AA(4, 7) = AA(4, 7) - zi[1];
		AA(7, 8) = AA(7, 8) - zi[1];
		AA(11, 9) = AA(11, 9) - zi[1];
		AA(16, 10) = AA(16, 10) - zi[1];
		AA(5, 11) = AA(5, 11) - zi[2];
		AA(8, 12) = AA(8, 12) - zi[2];
		AA(12, 13) = AA(12, 13) - zi[2];
		AA(17, 14) = AA(17, 14) - zi[3];
		AA(9, 15) = AA(9, 15) - zi[4];
		AA(13, 16) = AA(13, 16) - zi[4];
		AA(18, 17) = AA(18, 17) - zi[4];
		AA(14, 18) = AA(14, 18) - zi[5];
		AA(19, 19) = AA(19, 19) - zi[5];
		AA(20, 20) = AA(20, 20) - zi[7];
		Eigen::VectorXd s = AA.leftCols(20).colPivHouseholderQr().solve(-AA.col(20));
		sols.push_back(Eigen::Vector3d(s(18), s(19), zi[0]));
	}

	return sols;
}